

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O2

deBool deProcess_start(deProcess *process,char *commandLine,char *workingDirectory)

{
  size_t numBytes;
  int iVar1;
  __pid_t __pid;
  deBool dVar2;
  ssize_t sVar3;
  int *piVar4;
  deFile *pdVar5;
  deCommandLine *pdVar6;
  char **__argv;
  char **extraout_RAX;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  uint __fd;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  int statusPipe [2];
  int pipeErr [2];
  int pipeOut [2];
  int pipeIn [2];
  int procStatus;
  char errBuf [256];
  
  pipeIn[0] = -1;
  pipeIn[1] = -1;
  pipeOut[0] = -1;
  pipeOut[1] = -1;
  pipeErr[0] = -1;
  pipeErr[1] = -1;
  statusPipe[0] = -1;
  statusPipe[1] = -1;
  if (process->state == PROCESSSTATE_FINISHED) {
    deProcess_cleanupHandles(process);
    process->state = PROCESSSTATE_NOT_STARTED;
  }
  else if (process->state == PROCESSSTATE_RUNNING) {
    deProcess_setError(process,"Process already running");
    return 0;
  }
  iVar1 = pipe(pipeIn);
  if ((((iVar1 < 0) || (iVar1 = pipe(pipeOut), iVar1 < 0)) || (iVar1 = pipe(pipeErr), iVar1 < 0)) ||
     (iVar1 = pipe(statusPipe), iVar1 < 0)) {
    pcVar12 = "pipe() failed";
LAB_0011e634:
    deProcess_setErrorFromErrno(process,pcVar12);
    closePipe(pipeIn);
    closePipe(pipeOut);
    closePipe(pipeErr);
    closePipe(statusPipe);
    return 0;
  }
  __pid = fork();
  if (__pid < 0) {
    pcVar12 = "fork() failed";
    goto LAB_0011e634;
  }
  if (__pid != 0) {
    close(statusPipe[1]);
    lVar14 = 1;
    do {
      sVar3 = read(statusPipe[0],errBuf,1);
      if (sVar3 != -1) {
        if (0 < sVar3) {
          procStatus = 0;
          goto LAB_0011e685;
        }
        break;
      }
      piVar4 = __errno_location();
    } while ((*piVar4 == 4) || (*piVar4 == 0xb));
    close(statusPipe[0]);
    process->pid = __pid;
    process->state = PROCESSSTATE_RUNNING;
    close(pipeIn[0]);
    close(pipeOut[1]);
    close(pipeErr[1]);
    pdVar5 = deFile_createFromHandle((long)pipeIn[1]);
    process->standardIn = pdVar5;
    pdVar5 = deFile_createFromHandle((long)pipeOut[0]);
    process->standardOut = pdVar5;
    pdVar5 = deFile_createFromHandle((long)pipeErr[0]);
    process->standardErr = pdVar5;
    if (process->standardIn == (deFile *)0x0) {
      close(pipeIn[1]);
    }
    if (process->standardOut == (deFile *)0x0) {
      close(pipeOut[0]);
    }
    if (process->standardErr == (deFile *)0x0) {
      close(pipeErr[0]);
      return 1;
    }
    return 1;
  }
  close(pipeIn[1]);
  close(pipeOut[0]);
  close(pipeErr[0]);
  close(statusPipe[0]);
  __fd = 2;
  iVar1 = fcntl(statusPipe[1],2,1);
  if (iVar1 == 0) {
    iVar1 = 0;
    pdVar6 = (deCommandLine *)commandLine;
    if (pipeIn[0] == 0) {
LAB_0011e807:
      close(iVar1);
      iVar1 = 1;
      if (pipeOut[1] != 1) {
        iVar1 = dup2(pipeOut[1],1);
        if (iVar1 != 1) goto LAB_0011e89a;
        iVar1 = pipeOut[1];
      }
      close(iVar1);
      if (pipeErr[1] != 2) {
        iVar1 = dup2(pipeErr[1],2);
        if (iVar1 != 2) goto LAB_0011e89a;
        __fd = pipeErr[1];
      }
      close(__fd);
      __fd = statusPipe[1];
      pdVar6 = deCommandLine_parse(commandLine);
      if ((pdVar6 != (deCommandLine *)0x0) &&
         (__argv = (char **)deCalloc((long)pdVar6->numArgs * 8 + 8), commandLine = (char *)pdVar6,
         __argv != (char **)0x0)) goto LAB_0011e8aa;
      die(__fd,"Command line parsing failed (out of memory)");
      goto LAB_0011e88a;
    }
    iVar1 = dup2(pipeIn[0],0);
    if (iVar1 == 0) {
      iVar1 = pipeIn[0];
      goto LAB_0011e807;
    }
  }
  else {
LAB_0011e88a:
    dieLastError(statusPipe[1],"Failed to set FD_CLOEXEC");
    pdVar6 = (deCommandLine *)commandLine;
  }
LAB_0011e89a:
  dieLastError(statusPipe[1],"dup2() failed");
  __argv = extraout_RAX;
LAB_0011e8aa:
  if ((workingDirectory == (char *)0x0) || (iVar1 = chdir(workingDirectory), iVar1 == 0)) {
    uVar11 = 0;
    uVar7 = (ulong)(uint)pdVar6->numArgs;
    if (pdVar6->numArgs < 1) {
      uVar7 = uVar11;
    }
    for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      __argv[uVar11] = pdVar6->args[uVar11];
    }
    __argv[uVar7] = (char *)0x0;
    if (workingDirectory != (char *)0x0) {
      pcVar12 = *__argv;
      sVar8 = strlen(workingDirectory);
      sVar9 = sVar8 + 1;
      do {
        if (sVar9 == 1) goto LAB_0011e8ec;
        numBytes = sVar9 - 1;
        lVar14 = sVar9 - 2;
        sVar9 = numBytes;
      } while (workingDirectory[lVar14] == '/');
      dVar2 = deMemoryEqual(pcVar12,workingDirectory,numBytes);
      if ((dVar2 != 0) && (pcVar12[numBytes] == '/')) {
        pcVar12 = *__argv;
        sVar8 = strlen(workingDirectory);
        sVar10 = strlen(pcVar12);
        do {
          sVar13 = sVar8;
          if (sVar13 == 0) break;
          sVar8 = sVar13 - 1;
        } while (workingDirectory[sVar13 - 1] == '/');
        memmove(pcVar12,pcVar12 + sVar13 + 1,sVar10 - sVar13);
      }
    }
LAB_0011e8ec:
    execv(*__argv,__argv);
    pcVar12 = "execv() failed";
  }
  else {
    pcVar12 = "chdir() failed";
  }
  uVar7 = (ulong)__fd;
  dieLastError(__fd,pcVar12);
  if (*(void **)(uVar7 + 8) != (void *)0x0) {
    deFree(*(void **)(uVar7 + 8));
    *(undefined8 *)(uVar7 + 8) = 0;
  }
  pcVar12 = deStrdup(pcVar12);
  *(char **)(uVar7 + 8) = pcVar12;
  return (deBool)pcVar12;
LAB_0011e685:
  if (lVar14 == 0x100) {
LAB_0011e756:
    errBuf[lVar14] = '\0';
    close(statusPipe[0]);
    closePipe(pipeIn);
    closePipe(pipeOut);
    closePipe(pipeErr);
    waitpid(__pid,&procStatus,0);
    deProcess_setError(process,errBuf);
    return 0;
  }
  sVar3 = read(statusPipe[0],errBuf + lVar14,1);
  if (sVar3 == -1) goto LAB_0011e756;
  lVar14 = lVar14 + 1;
  goto LAB_0011e685;
}

Assistant:

deBool deProcess_start (deProcess* process, const char* commandLine, const char* workingDirectory)
{
	pid_t		pid				= 0;
	int			pipeIn[2]		= { -1, -1 };
	int			pipeOut[2]		= { -1, -1 };
	int			pipeErr[2]		= { -1, -1 };
	int			statusPipe[2]	= { -1, -1 };

	if (process->state == PROCESSSTATE_RUNNING)
	{
		deProcess_setError(process, "Process already running");
		return DE_FALSE;
	}
	else if (process->state == PROCESSSTATE_FINISHED)
	{
		deProcess_cleanupHandles(process);
		process->state = PROCESSSTATE_NOT_STARTED;
	}

	if (pipe(pipeIn) < 0 || pipe(pipeOut) < 0 || pipe(pipeErr) < 0 || pipe(statusPipe) < 0)
	{
		deProcess_setErrorFromErrno(process, "pipe() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	pid = fork();

	if (pid < 0)
	{
		deProcess_setErrorFromErrno(process, "fork() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	if (pid == 0)
	{
		/* Child process. */

		/* Close unused endpoints. */
		close(pipeIn[1]);
		close(pipeOut[0]);
		close(pipeErr[0]);
		close(statusPipe[0]);

		/* Set status pipe to close on exec(). That way parent will know that exec() succeeded. */
		if (fcntl(statusPipe[1], F_SETFD, FD_CLOEXEC) != 0)
			dieLastError(statusPipe[1], "Failed to set FD_CLOEXEC");

		/* Map stdin. */
		if (pipeIn[0] != STDIN_FILENO &&
			dup2(pipeIn[0], STDIN_FILENO) != STDIN_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeIn[0]);

		/* Stdout. */
		if (pipeOut[1] != STDOUT_FILENO &&
			dup2(pipeOut[1], STDOUT_FILENO) != STDOUT_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeOut[1]);

		/* Stderr. */
		if (pipeErr[1] != STDERR_FILENO &&
			dup2(pipeErr[1], STDERR_FILENO) != STDERR_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeErr[1]);

		/* Doesn't return. */
		execProcess(commandLine, workingDirectory, statusPipe[1]);
	}
	else
	{
		/* Parent process. */

		/* Check status. */
		{
			char	errBuf[256];
			ssize_t	result = 0;

			close(statusPipe[1]);
			while ((result = read(statusPipe[0], errBuf, 1)) == -1)
				if (errno != EAGAIN && errno != EINTR) break;

			if (result > 0)
			{
				int procStatus = 0;

				/* Read full error msg. */
				int errPos = 1;
				while (errPos < DE_LENGTH_OF_ARRAY(errBuf))
				{
					result = read(statusPipe[0], errBuf+errPos, 1);
					if (result == -1)
						break; /* Done. */

					errPos += 1;
				}

				/* Make sure str is null-terminated. */
				errBuf[errPos] = 0;

				/* Close handles. */
				close(statusPipe[0]);
				closePipe(pipeIn);
				closePipe(pipeOut);
				closePipe(pipeErr);

				/* Run waitpid to clean up zombie. */
				waitpid(pid, &procStatus, 0);

				deProcess_setError(process, errBuf);

				return DE_FALSE;
			}

			/* Status pipe is not needed. */
			close(statusPipe[0]);
		}

		/* Set running state. */
		process->pid		= pid;
		process->state		= PROCESSSTATE_RUNNING;

		/* Stdin, stdout. */
		close(pipeIn[0]);
		close(pipeOut[1]);
		close(pipeErr[1]);

		process->standardIn		= deFile_createFromHandle((deUintptr)pipeIn[1]);
		process->standardOut	= deFile_createFromHandle((deUintptr)pipeOut[0]);
		process->standardErr	= deFile_createFromHandle((deUintptr)pipeErr[0]);

		if (!process->standardIn)
			close(pipeIn[1]);

		if (!process->standardOut)
			close(pipeOut[0]);

		if (!process->standardErr)
			close(pipeErr[0]);
	}

	return DE_TRUE;
}